

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.hh
# Opt level: O0

void __thiscall
tchecker::graph::directed::
graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
::remove_edge<tchecker::graph::directed::details::incoming>
          (graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
           *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
                 *e)

{
  bool bVar1;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  *piVar3;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  *peVar4;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
  *pmVar5;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  *piVar6;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  local_a0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  local_98;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  local_90;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  local_88;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  local_80;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  local_78;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  local_70;
  int local_64;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  local_60;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  it;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  next;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  prev;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  end;
  undefined1 local_30 [8];
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
  range;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  n;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  *e_local;
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  *this_local;
  
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(e);
  piVar3 = edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
           ::node<tchecker::graph::directed::details::incoming>
                     (&(pmVar2->
                       super_edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                       ).
                       super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                     );
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
              *)&range._end,piVar3);
  edges<tchecker::graph::directed::details::incoming>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
              *)local_30,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
              *)this);
  peVar4 = range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
           ::end((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
                  *)local_30);
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  ::edge_iterator_t((edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                     *)&prev,peVar4);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&next,(make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                    *)0x0);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            (&it._edge,
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
              *)0x0);
  peVar4 = range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
           ::begin((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
                    *)local_30);
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  ::edge_iterator_t(&local_60,peVar4);
  do {
    bVar1 = edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
            ::operator!=(&local_60,
                         (edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                          *)&prev);
    if (!bVar1) {
      local_64 = 2;
LAB_0020a9c8:
      edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
      ::~edge_iterator_t(&local_60);
      if (local_64 != 2) {
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&it._edge);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&next);
        edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
        ::~edge_iterator_t((edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                            *)&prev);
        range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
        ::~range_t((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>_>
                    *)local_30);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
                    *)&range._end);
        return;
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/graph/directed_graph.hh"
                    ,0x1e7,
                    "void tchecker::graph::directed::graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t, tchecker::zg::path::concrete::edge_t>>>, tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t, tchecker::zg::path::concrete::edge_t>>>>::remove_edge(const EDGE_PTR &) [NODE_PTR = tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t, tchecker::zg::path::concrete::edge_t>>>, EDGE_PTR = tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t, tchecker::zg::path::concrete::edge_t>>>, TAG = tchecker::graph::directed::details::incoming]"
                   );
    }
    edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
    ::operator*(&local_70);
    bVar1 = tchecker::operator==(&local_70._edge,e);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_70._edge);
    if (bVar1) {
      edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
      ::operator++(&local_60);
      bVar1 = edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
              ::operator!=(&local_60,
                           (edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                            *)&prev);
      if (bVar1) {
        edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
        ::operator*(&local_78);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::operator=(&it._edge,&local_78._edge);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_78._edge);
      }
      else {
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::intrusive_shared_ptr_t
                  (&local_80,
                   (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                    *)0x0);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::operator=(&it._edge,&local_80);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_80);
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::intrusive_shared_ptr_t
                (&local_88,
                 (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                  *)0x0);
      bVar1 = tchecker::operator==(&next,&local_88);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_88);
      if (bVar1) {
        pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
                               *)&range._end);
        piVar6 = node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                 ::head<tchecker::graph::directed::details::incoming>
                           (&(pmVar5->
                             super_node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                             ).
                             super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                           );
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::operator=(piVar6,&it._edge);
      }
      else {
        pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->(&next);
        piVar6 = edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                 ::next<tchecker::graph::directed::details::incoming>
                           (&(pmVar2->
                             super_edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                             ).
                             super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                           );
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
        ::operator=(piVar6,&it._edge);
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::intrusive_shared_ptr_t
                (&local_90,
                 (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                  *)0x0);
      pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
               ::operator->(e);
      piVar6 = edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
               ::next<tchecker::graph::directed::details::incoming>
                         (&(pmVar2->
                           super_edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                           ).
                           super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                         );
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::operator=(piVar6,&local_90);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_90);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::intrusive_shared_ptr_t
                (&local_98,
                 (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                  *)0x0);
      pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
               ::operator->(e);
      piVar3 = edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
               ::node<tchecker::graph::directed::details::incoming>
                         (&(pmVar2->
                           super_edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                           ).
                           super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                         );
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::operator=(piVar3,&local_98);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_98);
      local_64 = 1;
      goto LAB_0020a9c8;
    }
    edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
    ::operator*(&local_a0);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
    ::operator=(&next,&local_a0._edge);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_a0._edge);
    edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
    ::operator++(&local_60);
  } while( true );
}

Assistant:

void remove_edge(EDGE_PTR const & e)
  {
    NODE_PTR n = e->template node<TAG>();
    auto range = edges<TAG>(n);
    auto end = range.end();
    EDGE_PTR prev{nullptr}, next{nullptr};

    for (auto it = range.begin(); it != end; ++it) {
      if (*it == e) {
        // get next edge in list (if any)
        ++it;
        if (it != end)
          next = *it;
        else // no next edge
          next = EDGE_PTR{nullptr};

        // remove edge
        if (prev == EDGE_PTR{nullptr}) // first edge in list
          n->template head<TAG>() = next;
        else
          prev->template next<TAG>() = next;

        e->template next<TAG>() = EDGE_PTR{nullptr};
        e->template node<TAG>() = NODE_PTR{nullptr};

        return;
      }
      prev = *it;
    }
    assert(false); // e is not in the list of edges with identifier TAG from node n
  }